

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * base64_encode(char *s,size_t len)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  ulong in_RSI;
  byte *in_RDI;
  char *out;
  char *d;
  int v;
  char *local_28;
  ulong local_18;
  byte *local_10;
  char *local_8;
  
  local_8 = (char *)malloc((in_RSI * 4 + 2) / 3 + 1);
  local_28 = local_8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    while (2 < local_18) {
      bVar1 = local_10[2];
      uVar2 = (uint)*local_10 << 0x10 | (uint)local_10[1] << 8 | (uint)bVar1;
      local_10 = local_10 + 3;
      local_18 = local_18 - 3;
      *local_28 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)uVar2 >> 0x12];
      local_28[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((int)uVar2 >> 0xc & 0x3f)];
      local_28[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((int)uVar2 >> 6 & 0x3f)];
      local_28[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)(bVar1 & 0x3f)];
      local_28 = local_28 + 4;
    }
    if (local_18 != 0) {
      if (local_18 == 1) {
        bVar1 = *local_10;
        pcVar3 = local_28 + 1;
        *local_28 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((uint)bVar1 << 0x10) >> 0x12];
        local_28 = local_28 + 2;
        *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)((uint)bVar1 << 0x10) >> 0xc & 0x3f)];
      }
      else if (local_18 == 2) {
        uVar2 = (uint)*local_10 << 0x10 | (uint)local_10[1] << 8;
        *local_28 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)uVar2 >> 0x12];
        pcVar3 = local_28 + 2;
        local_28[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)((int)uVar2 >> 0xc & 0x3f)];
        local_28 = local_28 + 3;
        *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar2 >> 6 & 0x3f)];
      }
    }
    *local_28 = '\0';
  }
  return local_8;
}

Assistant:

static char *
base64_encode(const char *s, size_t len)
{
	static const char digits[64] =
	    { 'A','B','C','D','E','F','G','H','I','J','K','L','M','N','O',
	      'P','Q','R','S','T','U','V','W','X','Y','Z','a','b','c','d',
	      'e','f','g','h','i','j','k','l','m','n','o','p','q','r','s',
	      't','u','v','w','x','y','z','0','1','2','3','4','5','6','7',
	      '8','9','+','/' };
	int v;
	char *d, *out;

	/* 3 bytes becomes 4 chars, but round up and allow for trailing NUL */
	out = (char *)malloc((len * 4 + 2) / 3 + 1);
	if (out == NULL)
		return (NULL);
	d = out;

	/* Convert each group of 3 bytes into 4 characters. */
	while (len >= 3) {
		v = (((int)s[0] << 16) & 0xff0000)
		    | (((int)s[1] << 8) & 0xff00)
		    | (((int)s[2]) & 0x00ff);
		s += 3;
		len -= 3;
		*d++ = digits[(v >> 18) & 0x3f];
		*d++ = digits[(v >> 12) & 0x3f];
		*d++ = digits[(v >> 6) & 0x3f];
		*d++ = digits[(v) & 0x3f];
	}
	/* Handle final group of 1 byte (2 chars) or 2 bytes (3 chars). */
	switch (len) {
	case 0: break;
	case 1:
		v = (((int)s[0] << 16) & 0xff0000);
		*d++ = digits[(v >> 18) & 0x3f];
		*d++ = digits[(v >> 12) & 0x3f];
		break;
	case 2:
		v = (((int)s[0] << 16) & 0xff0000)
		    | (((int)s[1] << 8) & 0xff00);
		*d++ = digits[(v >> 18) & 0x3f];
		*d++ = digits[(v >> 12) & 0x3f];
		*d++ = digits[(v >> 6) & 0x3f];
		break;
	}
	/* Add trailing NUL character so output is a valid C string. */
	*d = '\0';
	return (out);
}